

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttrListImpl.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::VecAttrListImpl::getType(VecAttrListImpl *this,XMLCh *name)

{
  bool bVar1;
  XMLAttr *this_00;
  XMLCh *pXVar2;
  ulong getAt;
  
  getAt = 0;
  do {
    if (this->fCount <= getAt) {
      return (XMLCh *)0x0;
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
    pXVar2 = XMLAttr::getQName(this_00);
    bVar1 = XMLString::equals(pXVar2,name);
    getAt = getAt + 1;
  } while (!bVar1);
  pXVar2 = XMLAttDef::getAttTypeString
                     (this_00->fType,
                      (this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fMemoryManager);
  return pXVar2;
}

Assistant:

const XMLCh* VecAttrListImpl::getType(const XMLCh* const name) const
{
    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), name))
            return XMLAttDef::getAttTypeString(curElem->getType(), fVector->getMemoryManager());
    }
    return 0;
}